

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void record_best_compound
               (REFERENCE_MODE reference_mode,RD_STATS *rd_stats,int comp_pred,int rdmult,
               InterModeSearchState *search_state,int compmode_cost)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int64_t hybrid_rate;
  int64_t single_rate;
  int64_t hybrid_rd;
  int64_t single_rd;
  int compmode_cost_local;
  InterModeSearchState *search_state_local;
  int rdmult_local;
  int comp_pred_local;
  RD_STATS *rd_stats_local;
  REFERENCE_MODE reference_mode_local;
  
  if (reference_mode == '\x02') {
    iVar1 = rd_stats->rate - compmode_cost;
    iVar2 = rd_stats->rate;
  }
  else {
    iVar1 = rd_stats->rate;
    iVar2 = rd_stats->rate + compmode_cost;
  }
  single_rate = (int64_t)iVar1;
  hybrid_rate = (int64_t)iVar2;
  lVar3 = (single_rate * rdmult + 0x100 >> 9) + rd_stats->dist * 0x80;
  lVar4 = (hybrid_rate * rdmult + 0x100 >> 9) + rd_stats->dist * 0x80;
  if (comp_pred == 0) {
    if (lVar3 < search_state->best_pred_rd[0]) {
      search_state->best_pred_rd[0] = lVar3;
    }
  }
  else if (lVar3 < search_state->best_pred_rd[1]) {
    search_state->best_pred_rd[1] = lVar3;
  }
  if (lVar4 < search_state->best_pred_rd[2]) {
    search_state->best_pred_rd[2] = lVar4;
  }
  return;
}

Assistant:

static void record_best_compound(REFERENCE_MODE reference_mode,
                                 RD_STATS *rd_stats, int comp_pred, int rdmult,
                                 InterModeSearchState *search_state,
                                 int compmode_cost) {
  int64_t single_rd, hybrid_rd, single_rate, hybrid_rate;

  if (reference_mode == REFERENCE_MODE_SELECT) {
    single_rate = rd_stats->rate - compmode_cost;
    hybrid_rate = rd_stats->rate;
  } else {
    single_rate = rd_stats->rate;
    hybrid_rate = rd_stats->rate + compmode_cost;
  }

  single_rd = RDCOST(rdmult, single_rate, rd_stats->dist);
  hybrid_rd = RDCOST(rdmult, hybrid_rate, rd_stats->dist);

  if (!comp_pred) {
    if (single_rd < search_state->best_pred_rd[SINGLE_REFERENCE])
      search_state->best_pred_rd[SINGLE_REFERENCE] = single_rd;
  } else {
    if (single_rd < search_state->best_pred_rd[COMPOUND_REFERENCE])
      search_state->best_pred_rd[COMPOUND_REFERENCE] = single_rd;
  }
  if (hybrid_rd < search_state->best_pred_rd[REFERENCE_MODE_SELECT])
    search_state->best_pred_rd[REFERENCE_MODE_SELECT] = hybrid_rd;
}